

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V2_Annotation::Read(ON_OBSOLETE_V2_Annotation *this,ON_BinaryArchive *file)

{
  ON_2dPoint *pOVar1;
  bool bVar2;
  V5_eAnnotationType VVar3;
  ulong uVar4;
  ON_2dPoint *pOVar5;
  ulong uVar6;
  bool bVar7;
  uint ui;
  int major_version;
  int minor_version;
  ON__UINT32 local_1c;
  int local_18 [2];
  
  Destroy(this);
  local_18[0] = 0;
  local_18[1] = 0;
  bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18,local_18 + 1);
  if ((bVar2) && (local_18[0] == 1)) {
    local_1c = 0;
    bVar2 = ON_BinaryArchive::ReadInt(file,&local_1c);
    if (bVar2) {
      VVar3 = ON_INTERNAL_OBSOLETE::V5AnnotationTypeFromUnsigned(local_1c);
      this->m_type = VVar3;
      bVar2 = ON_BinaryArchive::ReadPlane(file,&this->m_plane);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::ReadArray(file,&this->m_points);
        if (bVar2) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_usertext);
          if (bVar2) {
            bVar2 = ON_BinaryArchive::ReadString(file,&this->m_defaulttext);
            if (bVar2) {
              local_1c = 0;
              bVar2 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_1c);
              if (bVar2) {
                this->m_userpositionedtext = local_1c != 0;
              }
              goto LAB_004ae1e4;
            }
          }
        }
      }
    }
    bVar2 = false;
  }
LAB_004ae1e4:
  if (((1e+150 < ABS((this->m_plane).origin.x)) || (1e+150 < ABS((this->m_plane).origin.y))) ||
     (1e+150 < ABS((this->m_plane).origin.z))) {
    bVar2 = false;
  }
  else {
    uVar4 = (ulong)(this->m_points).m_count;
    if ((long)uVar4 < 1) {
      bVar7 = true;
    }
    else {
      pOVar1 = (this->m_points).m_a;
      if (ABS(pOVar1->x) <= 1e+150) {
        uVar6 = 1;
        bVar7 = false;
        do {
          pOVar5 = pOVar1 + 1;
          if ((1e+150 < ABS(pOVar1->y)) || (bVar7 = uVar4 <= uVar6, uVar6 == uVar4)) break;
          uVar6 = uVar6 + 1;
          pOVar1 = pOVar5;
        } while (ABS(pOVar5->x) <= 1e+150);
      }
      else {
        bVar7 = false;
      }
    }
    bVar2 = (bool)(bVar2 & bVar7);
  }
  return bVar2;
}

Assistant:

bool ON_OBSOLETE_V2_Annotation::Read( ON_BinaryArchive& file )
{
  Destroy();
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    if (rc)
    {
      unsigned int ui = 0;
      rc = file.ReadInt( &ui );
      if (rc)
        m_type = ON_INTERNAL_OBSOLETE::V5AnnotationTypeFromUnsigned(ui);
    }
    if (rc)
      rc = file.ReadPlane( m_plane );
    if (rc)
      rc = file.ReadArray( m_points );
    if (rc)
      rc = file.ReadString( m_usertext );
    if (rc)
      rc = file.ReadString( m_defaulttext );
    if( rc )
    {
      int i = 0;
      rc = file.ReadInt( &i );
      if (rc)
        m_userpositionedtext = (i ? true : false);
    }
  }

  if( fabs( m_plane.origin.x) > REALLY_BIG_NUMBER || fabs( m_plane.origin.y) > REALLY_BIG_NUMBER || fabs( m_plane.origin.z) > REALLY_BIG_NUMBER)
    return false;

  for( int i = 0; i < m_points.Count(); i++)
  {
    if( fabs( m_points[i].x) > REALLY_BIG_NUMBER || fabs( m_points[i].y) > REALLY_BIG_NUMBER)
      return false;
  }


  return rc;
}